

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O3

SinkResultType __thiscall
duckdb::PhysicalHashAggregate::Sink
          (PhysicalHashAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  _Atomic_word *p_Var1;
  GlobalSinkState *pGVar2;
  LocalSinkState *pLVar3;
  pointer puVar4;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  int iVar7;
  pointer pEVar8;
  BoundAggregateExpression *pBVar9;
  BoundReferenceExpression *pBVar10;
  reference pvVar11;
  reference pvVar12;
  const_iterator cVar13;
  reference this_00;
  reference this_01;
  const_reference this_02;
  size_type __n;
  size_type sVar14;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_03;
  size_type __n_00;
  pointer this_04;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *aggregate;
  OperatorSinkInput sink_input;
  InterruptState interrupt_state;
  DataChunk *local_a8;
  OperatorSinkInput local_70;
  InterruptState local_58;
  
  pGVar2 = input->global_state;
  pLVar3 = input->local_state;
  if ((this->distinct_collection_info).
      super_unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DistinctAggregateCollectionInfo_*,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      .super__Head_base<0UL,_duckdb::DistinctAggregateCollectionInfo_*,_false>._M_head_impl !=
      (DistinctAggregateCollectionInfo *)0x0) {
    SinkDistinct(this,context,chunk,input);
  }
  this_04 = (this->grouped_aggregate_data).aggregates.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->grouped_aggregate_data).aggregates.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->filter_indexes)._M_h._M_element_count == 0) {
    if (this_04 != puVar4) {
      if ((this->non_distinct_filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->non_distinct_filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return NEED_MORE_INPUT;
      }
      goto LAB_00b6581e;
    }
  }
  else {
LAB_00b6581e:
    if (this_04 != puVar4) {
      __n = 0;
      do {
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_04);
        pBVar9 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                           (&pEVar8->super_BaseExpression);
        puVar5 = (pBVar9->children).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_03 = (pBVar9->children).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_03 != puVar5;
            this_03 = this_03 + 1) {
          pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(this_03);
          pBVar10 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                              (&pEVar8->super_BaseExpression);
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              ((vector<duckdb::Vector,_true> *)(pLVar3 + 1),__n);
          pvVar12 = vector<duckdb::Vector,_true>::operator[](&chunk->data,pBVar10->index);
          Vector::Reference(pvVar11,pvVar12);
          __n = __n + 1;
        }
        this_04 = this_04 + 1;
      } while (this_04 != puVar4);
      this_04 = (this->grouped_aggregate_data).aggregates.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_00b65929;
    }
  }
  __n = 0;
LAB_00b65929:
  local_a8 = (DataChunk *)(pLVar3 + 1);
  puVar4 = (this->grouped_aggregate_data).aggregates.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_04 != puVar4) {
    do {
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_04);
      pBVar9 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar8->super_BaseExpression)
      ;
      _Var6._M_head_impl =
           (pBVar9->filter).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      sVar14 = __n;
      if (_Var6._M_head_impl != (Expression *)0x0) {
        local_58._0_8_ = _Var6._M_head_impl;
        cVar13 = ::std::
                 _Hashtable<duckdb::Expression_*,_std::pair<duckdb::Expression_*const,_unsigned_long>,_std::allocator<std::pair<duckdb::Expression_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Expression_*>,_std::hash<duckdb::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->filter_indexes)._M_h,(key_type *)&local_58);
        sVar14 = __n + 1;
        pvVar11 = vector<duckdb::Vector,_true>::operator[]
                            ((vector<duckdb::Vector,_true> *)local_a8,__n);
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&chunk->data,
                             *(size_type *)
                              ((long)cVar13.
                                     super__Node_iterator_base<std::pair<duckdb::Expression_*const,_unsigned_long>,_false>
                                     ._M_cur + 0x10));
        Vector::Reference(pvVar11,pvVar12);
      }
      this_04 = this_04 + 1;
      __n = sVar14;
    } while (this_04 != puVar4);
  }
  pLVar3[1].partition_info.partition_data.
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)chunk->count;
  DataChunk::Verify(local_a8);
  if ((this->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->groupings).
      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      .
      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      this_00 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                          ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)(pGVar2 + 1),
                           __n_00);
      this_01 = vector<duckdb::HashAggregateGroupingLocalState,_true>::operator[]
                          ((vector<duckdb::HashAggregateGroupingLocalState,_true> *)
                           &pLVar3[2].partition_info.min_batch_index,__n_00);
      InterruptState::InterruptState(&local_58);
      local_70.global_state =
           unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator*(&this_00->table_state);
      local_70.local_state =
           unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
           operator*(&this_01->table_state);
      local_70.interrupt_state = &local_58;
      this_02 = vector<duckdb::HashAggregateGroupingData,_true>::operator[](&this->groupings,__n_00)
      ;
      RadixPartitionedHashTable::Sink
                (&this_02->table_data,context,chunk,&local_70,local_a8,&this->non_distinct_filter);
      if (local_58.signal_state.internal.
          super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_58.signal_state.internal.
                     super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
          iVar7 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar7 = (local_58.signal_state.internal.
                   super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
          (local_58.signal_state.internal.
           super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count = iVar7 + -1;
        }
        if (iVar7 == 1) {
          (*(local_58.signal_state.internal.
             super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        }
      }
      if (local_58.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_58.current_task.internal.
                     super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_weak_count;
          iVar7 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar7 = (local_58.current_task.internal.
                   super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
          (local_58.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_weak_count = iVar7 + -1;
        }
        if (iVar7 == 1) {
          (*(local_58.current_task.internal.
             super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[3])();
        }
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)(this->groupings).
                                     super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                     .
                                     super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->groupings).
                                     super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                     .
                                     super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             0x6db6db6db6db6db7));
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalHashAggregate::Sink(ExecutionContext &context, DataChunk &chunk,
                                           OperatorSinkInput &input) const {
	auto &local_state = input.local_state.Cast<HashAggregateLocalSinkState>();
	auto &global_state = input.global_state.Cast<HashAggregateGlobalSinkState>();

	if (distinct_collection_info) {
		SinkDistinct(context, chunk, input);
	}

	if (CanSkipRegularSink()) {
		return SinkResultType::NEED_MORE_INPUT;
	}

	DataChunk &aggregate_input_chunk = local_state.aggregate_input_chunk;
	auto &aggregates = grouped_aggregate_data.aggregates;
	idx_t aggregate_input_idx = 0;

	// Populate the aggregate child vectors
	for (auto &aggregate : aggregates) {
		auto &aggr = aggregate->Cast<BoundAggregateExpression>();
		for (auto &child_expr : aggr.children) {
			D_ASSERT(child_expr->GetExpressionType() == ExpressionType::BOUND_REF);
			auto &bound_ref_expr = child_expr->Cast<BoundReferenceExpression>();
			D_ASSERT(bound_ref_expr.index < chunk.data.size());
			aggregate_input_chunk.data[aggregate_input_idx++].Reference(chunk.data[bound_ref_expr.index]);
		}
	}
	// Populate the filter vectors
	for (auto &aggregate : aggregates) {
		auto &aggr = aggregate->Cast<BoundAggregateExpression>();
		if (aggr.filter) {
			auto it = filter_indexes.find(aggr.filter.get());
			D_ASSERT(it != filter_indexes.end());
			D_ASSERT(it->second < chunk.data.size());
			aggregate_input_chunk.data[aggregate_input_idx++].Reference(chunk.data[it->second]);
		}
	}

	aggregate_input_chunk.SetCardinality(chunk.size());
	aggregate_input_chunk.Verify();

	// For every grouping set there is one radix_table
	for (idx_t i = 0; i < groupings.size(); i++) {
		auto &grouping_global_state = global_state.grouping_states[i];
		auto &grouping_local_state = local_state.grouping_states[i];
		InterruptState interrupt_state;
		OperatorSinkInput sink_input {*grouping_global_state.table_state, *grouping_local_state.table_state,
		                              interrupt_state};

		auto &grouping = groupings[i];
		auto &table = grouping.table_data;
		table.Sink(context, chunk, sink_input, aggregate_input_chunk, non_distinct_filter);
	}

	return SinkResultType::NEED_MORE_INPUT;
}